

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPortDataTransfer.cpp
# Opt level: O0

void __thiscall CPortDataTransfer::Execute(CPortDataTransfer *this)

{
  int __fd;
  int iVar1;
  char *__cp;
  allocator local_61;
  undefined1 local_60 [8];
  string ret_1;
  undefined4 local_38;
  int ret;
  int opt;
  sockaddr_in bindaddr;
  sockaddr_in clientaddr;
  int clientsock;
  CPortDataTransfer *this_local;
  
  __fd = socket(2,1,0);
  __cp = (char *)std::__cxx11::string::c_str();
  bindaddr.sin_zero._4_4_ = inet_addr(__cp);
  bindaddr.sin_zero._2_2_ = htons((uint16_t)this->m_RemotePort);
  bindaddr.sin_zero[0] = '\x02';
  bindaddr.sin_zero[1] = '\0';
  ret._2_2_ = htons(0x1389);
  ret._0_2_ = 2;
  opt = 0;
  local_38 = 1;
  setsockopt(__fd,1,2,&local_38,4);
  iVar1 = bind(__fd,(sockaddr *)&ret,0x10);
  if (iVar1 == -1) {
    perror("bind error ");
  }
  iVar1 = connect(__fd,(sockaddr *)bindaddr.sin_zero,0x10);
  if (iVar1 == 0) {
    ret_1.field_2._12_4_ = DispatchCommand(this,__fd);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_60,"425 Failed to establish connection.\r\n",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    ControlSockSendMsg(this,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
  }
  close(__fd);
  if (this != (CPortDataTransfer *)0x0) {
    ~CPortDataTransfer(this);
    operator_delete(this);
  }
  return;
}

Assistant:

void CPortDataTransfer::Execute() {
    int clientsock = socket(AF_INET,SOCK_STREAM,0);
    struct sockaddr_in clientaddr,bindaddr;
    clientaddr.sin_addr.s_addr = inet_addr(m_RemoteIp.c_str());
    clientaddr.sin_port = htons(m_RemotePort);
    clientaddr.sin_family = AF_INET;

    bindaddr.sin_port = htons(5001);
    bindaddr.sin_family = AF_INET;
    bindaddr.sin_addr.s_addr = INADDR_ANY;

    int opt = 1;
    setsockopt(clientsock, SOL_SOCKET, SO_REUSEADDR, (const void *)&opt, sizeof(opt));

    if(bind(clientsock,(struct sockaddr*)&bindaddr,sizeof(bindaddr)) == -1){
        perror("bind error ");
    }


    if(0 == connect(clientsock,(struct sockaddr*)&clientaddr,sizeof(clientaddr))){
        int ret = DispatchCommand(clientsock);
    }
    else{
        string ret = "425 Failed to establish connection.\r\n";
        ControlSockSendMsg(ret);
    }

    close(clientsock);
    delete this;
}